

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlkpp.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
pg::ZLKPPSolver::get_nodes_of_max_priority
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,ZLKPPSolver *this,
          int max_priority)

{
  int iVar1;
  int *local_40;
  int *ptr2;
  int local_28 [2];
  int v;
  int local_1c;
  ZLKPPSolver *pZStack_18;
  int max_priority_local;
  ZLKPPSolver *this_local;
  vector<int,_std::allocator<int>_> *top;
  
  v._3_1_ = 0;
  local_1c = max_priority;
  pZStack_18 = this;
  this_local = (ZLKPPSolver *)__return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  if (this->cur_num_nodes != 0) {
    local_28[0] = this->cur_nodes_prev[this->cur_first_node];
    while (iVar1 = Solver::priority(&this->super_Solver,local_28[0]), iVar1 == local_1c) {
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,local_28);
      local_40 = Solver::outs(&this->super_Solver,local_28[0]);
      while( true ) {
        if (*local_40 < 0) {
          __assert_fail("*ptr2 >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/zlkpp.cpp"
                        ,0x80,"std::vector<int> pg::ZLKPPSolver::get_nodes_of_max_priority(int)");
        }
        if ((this->cur_nodes_bm[*local_40] & 1U) != 0) break;
        local_40 = local_40 + 1;
      }
      this->strategy[local_28[0]] = *local_40;
      if (local_28[0] == this->cur_first_node) {
        return __return_storage_ptr__;
      }
      local_28[0] = this->cur_nodes_prev[local_28[0]];
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> ZLKPPSolver::get_nodes_of_max_priority(int max_priority) {
    std::vector<int> top;
    if (!cur_num_nodes)
        return top;
    int v = cur_nodes_prev[cur_first_node];
    while (priority(v) == max_priority) {
        top.push_back(v);
        const int *ptr2 = outs(v);
        for (;; ++ptr2) {
            assert(*ptr2 >= 0);
            if (cur_nodes_bm[*ptr2])
                break;
        }
        strategy[v] = *ptr2; // we can go to an arbitrary node that is currently in the game
        if (v == cur_first_node)
            break;
        v = cur_nodes_prev[v];
    }
    return top; // the returned vector is sorted
}